

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setVisible(QWidgetPrivate *this,bool visible)

{
  byte bVar1;
  bool bVar2;
  QFlagsStorage<Qt::WindowState> rhs;
  QWidgetPrivate *this_00;
  QDebug *pQVar3;
  QWidget *pQVar4;
  QApplicationPrivate *this_01;
  QWidgetPrivate *pQVar5;
  QEvent *this_02;
  byte in_SIL;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000018;
  QWidget *parent;
  bool needUpdateGeometry;
  bool wasResized;
  QWidget *pw;
  QWidget *q;
  QEvent hideToParentEvent;
  QEvent showToParentEvent;
  WindowStates initialWindowState;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  QWidget *in_stack_ffffffffffffff10;
  QWidget *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff30;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffff34;
  QWidgetPrivate *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  QDebug *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff58;
  undefined2 uVar8;
  WId in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff70;
  QWidget *in_stack_ffffffffffffff78;
  QLayout *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  pQVar5 = in_RDI;
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetShowHide();
  anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff10,
             (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  while( true ) {
    bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    uVar8 = (undefined2)((ulong)pQVar5 >> 0x30);
    if (!bVar2) break;
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x37a1f4);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
               (char *)in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (char *)0x37a20d);
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
    QDebug::QDebug(&local_38,pQVar3);
    ::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pQVar3 = QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
    QDebug::QDebug(&local_28,pQVar3);
    anon_unknown.dwarf_2490c2::operator<<
              (in_stack_ffffffffffffff48,
               (WidgetAttributes *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
    QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    local_10 = 0;
  }
  if ((bVar1 & 1) == 0) {
    if ((QWidgetPrivate *)QApplicationPrivate::hidden_focus_widget == this_00) {
      QApplicationPrivate::hidden_focus_widget = (QWidget *)0x0;
    }
    bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
    if ((!bVar2) && (pQVar4 = QWidget::parentWidget((QWidget *)0x37a73d), pQVar4 != (QWidget *)0x0))
    {
      QWidget::parentWidget((QWidget *)0x37a74d);
      QWidget::d_func((QWidget *)0x37a755);
      setDirtyOpaqueRegion
                ((QWidgetPrivate *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    }
    bVar2 = QWidget::testAttribute
                      (in_stack_ffffffffffffff18,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    if (!bVar2) {
      QWidget::setAttribute
                (in_stack_ffffffffffffff78,
                 (WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
      hide_helper(in_stack_ffffffffffffff38);
    }
    bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
    if ((!bVar2) && (pQVar4 = QWidget::parentWidget((QWidget *)0x37a7aa), pQVar4 != (QWidget *)0x0))
    {
      QWidget::parentWidget((QWidget *)0x37a7be);
      pQVar5 = QWidget::d_func((QWidget *)0x37a7c6);
      if (pQVar5->layout == (QLayout *)0x0) {
        QWidget::parentWidget((QWidget *)0x37a7fb);
        bVar2 = QWidget::isVisible((QWidget *)0x37a803);
        if (bVar2) {
          pQVar4 = QWidget::parentWidget((QWidget *)0x37a813);
          this_02 = (QEvent *)operator_new(0x10);
          QEvent::QEvent(this_02,LayoutRequest);
          QCoreApplication::postEvent(&pQVar4->super_QObject,this_02,0);
        }
      }
      else {
        QWidget::parentWidget((QWidget *)0x37a7da);
        pQVar5 = QWidget::d_func((QWidget *)0x37a7e2);
        (**(code **)(*(long *)pQVar5->layout + 0x70))();
      }
    }
    QEvent::QEvent((QEvent *)&stack0xffffffffffffff68,HideToParent);
    QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&stack0xffffffffffffff68);
    QEvent::~QEvent((QEvent *)&stack0xffffffffffffff68);
    goto LAB_0037a889;
  }
  bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
  if ((!bVar2) && (pQVar4 = QWidget::parentWidget((QWidget *)0x37a353), pQVar4 != (QWidget *)0x0)) {
    QWidget::parentWidget((QWidget *)0x37a363);
    bVar2 = QWidget::isVisible((QWidget *)0x37a36b);
    if (bVar2) {
      QWidget::parentWidget((QWidget *)0x37a37b);
      bVar2 = QWidget::testAttribute
                        (in_stack_ffffffffffffff18,
                         (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      if (!bVar2) {
        QWidget::parentWidget((QWidget *)0x37a396);
        QWidget::window((QWidget *)
                        CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        QWidget::d_func((QWidget *)0x37a3a6);
        createRecursively((QWidgetPrivate *)
                          CONCAT44(in_stack_ffffffffffffff34.i,in_stack_ffffffffffffff30));
      }
    }
  }
  this_01 = (QApplicationPrivate *)QWidget::parentWidget((QWidget *)0x37a3b8);
  bVar2 = QWidget::testAttribute
                    (in_stack_ffffffffffffff18,
                     (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  if ((!bVar2) &&
     ((bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10), bVar2 ||
      (bVar2 = QWidget::testAttribute
                         (in_stack_ffffffffffffff18,
                          (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20)), bVar2)))) {
    QWidget::create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,SUB21((ushort)uVar8 >> 8,0),
                    SUB21(uVar8,0));
  }
  bVar1 = QWidget::testAttribute
                    (in_stack_ffffffffffffff18,
                     (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  rhs.i = (Int)QWidget::windowState(in_stack_ffffffffffffff10);
  QWidget::ensurePolished((QWidget *)in_stack_ffffffffffffff38);
  bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
  uVar7 = false;
  if (!bVar2) {
    uVar7 = QWidget::testAttribute
                      (in_stack_ffffffffffffff18,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  }
  bVar6 = uVar7;
  QWidget::setAttribute
            (in_stack_ffffffffffffff78,(WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
  if ((bVar6 & 1) != 0) {
    updateGeometry_helper(this_00,SUB81((ulong)this_01 >> 0x38,0));
  }
  if (in_RDI->layout != (QLayout *)0x0) {
    QLayout::activate(in_stack_ffffffffffffff80);
  }
  bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
  if (!bVar2) {
    pQVar4 = QWidget::parentWidget((QWidget *)0x37a4dc);
    while( true ) {
      bVar6 = 0;
      if (pQVar4 != (QWidget *)0x0) {
        bVar2 = QWidget::isVisible((QWidget *)0x37a4f9);
        bVar6 = 0;
        if (bVar2) {
          pQVar5 = QWidget::d_func((QWidget *)0x37a512);
          bVar6 = 0;
          if (pQVar5->layout != (QLayout *)0x0) {
            bVar6 = (*(uint *)&pQVar4->data->field_0x10 >> 10 & 1) != 0 ^ 0xff;
          }
        }
      }
      if ((bVar6 & 1) == 0) break;
      QWidget::d_func((QWidget *)0x37a557);
      QLayout::activate(in_stack_ffffffffffffff80);
      bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
      if (bVar2) break;
      pQVar4 = QWidget::parentWidget((QWidget *)0x37a57f);
    }
    if (pQVar4 != (QWidget *)0x0) {
      QWidget::d_func((QWidget *)0x37a59b);
      setDirtyOpaqueRegion
                ((QWidgetPrivate *)CONCAT17(uVar7,CONCAT16(bVar6,in_stack_ffffffffffffff20)));
    }
  }
  if ((bVar1 & 1) == 0) {
    bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
    if (!bVar2) {
      QWidget::parentWidget((QWidget *)0x37a5c8);
      pQVar5 = QWidget::d_func((QWidget *)0x37a5d0);
      if (pQVar5->layout != (QLayout *)0x0) goto LAB_0037a666;
    }
    bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
    if (bVar2) {
      QWidget::adjustSize(in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff34.i = (Int)QWidget::windowState(in_stack_ffffffffffffff10);
      bVar2 = ::operator!=((QFlags<Qt::WindowState>)in_stack_ffffffffffffff34.i,
                           (QFlags<Qt::WindowState>)rhs.i);
      if (bVar2) {
        QWidget::setWindowState
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff34.i,in_stack_ffffffffffffff30),
                   (QFlagsStorageHelper<Qt::WindowState,_4>)SUB84((ulong)this_00 >> 0x20,0));
      }
    }
    else {
      QWidget::adjustSize(in_stack_ffffffffffffff10);
    }
    QWidget::setAttribute
              (in_stack_ffffffffffffff78,(WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
  }
LAB_0037a666:
  QWidget::setAttribute
            (in_stack_ffffffffffffff78,(WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
  bVar2 = QWidget::isWindow(in_stack_ffffffffffffff10);
  if (bVar2) {
LAB_0037a69d:
    show_helper((QWidgetPrivate *)CONCAT44(in_stack_ffffffffffffff34.i,in_stack_ffffffffffffff30));
    QCoreApplication::instance();
    QApplication::d_func((QApplication *)0x37a6b4);
    QApplicationPrivate::sendSyntheticEnterLeave(this_01,in_stack_00000018);
  }
  else {
    QWidget::parentWidget((QWidget *)0x37a68f);
    bVar2 = QWidget::isVisible((QWidget *)0x37a697);
    if (bVar2) goto LAB_0037a69d;
  }
  QEvent::QEvent((QEvent *)&stack0xffffffffffffff78,ShowToParent);
  QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&stack0xffffffffffffff78);
  QEvent::~QEvent((QEvent *)&stack0xffffffffffffff78);
LAB_0037a889:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setVisible(bool visible)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Setting visibility of" << q
                              << "with attributes" << WidgetAttributes{q}
                              << "to" << visible << "via QWidgetPrivate";

    if (visible) { // show
        // Designer uses a trick to make grabWidget work without showing
        if (!q->isWindow() && q->parentWidget() && q->parentWidget()->isVisible()
            && !q->parentWidget()->testAttribute(Qt::WA_WState_Created))
            q->parentWidget()->window()->d_func()->createRecursively();

        //create toplevels but not children of non-visible parents
        QWidget *pw = q->parentWidget();
        if (!q->testAttribute(Qt::WA_WState_Created)
            && (q->isWindow() || pw->testAttribute(Qt::WA_WState_Created))) {
            q->create();
        }

        bool wasResized = q->testAttribute(Qt::WA_Resized);
        Qt::WindowStates initialWindowState = q->windowState();

        // polish if necessary
        q->ensurePolished();

        // whether we need to inform the parent widget immediately
        bool needUpdateGeometry = !q->isWindow() && q->testAttribute(Qt::WA_WState_Hidden);
        // we are no longer hidden
        q->setAttribute(Qt::WA_WState_Hidden, false);

        if (needUpdateGeometry)
            updateGeometry_helper(true);

        // activate our layout before we and our children become visible
        if (layout)
            layout->activate();

        if (!q->isWindow()) {
            QWidget *parent = q->parentWidget();
            while (parent && parent->isVisible() && parent->d_func()->layout  && !parent->data->in_show) {
                parent->d_func()->layout->activate();
                if (parent->isWindow())
                    break;
                parent = parent->parentWidget();
            }
            if (parent)
                parent->d_func()->setDirtyOpaqueRegion();
        }

        // adjust size if necessary
        if (!wasResized
            && (q->isWindow() || !q->parentWidget()->d_func()->layout))  {
            if (q->isWindow()) {
                q->adjustSize();
                if (q->windowState() != initialWindowState)
                    q->setWindowState(initialWindowState);
            } else {
                q->adjustSize();
            }
            q->setAttribute(Qt::WA_Resized, false);
        }

        q->setAttribute(Qt::WA_KeyboardFocusChange, false);

        if (q->isWindow() || q->parentWidget()->isVisible()) {
            show_helper();

            qApp->d_func()->sendSyntheticEnterLeave(q);
        }

        QEvent showToParentEvent(QEvent::ShowToParent);
        QCoreApplication::sendEvent(q, &showToParentEvent);
    } else { // hide
        if (QApplicationPrivate::hidden_focus_widget == q)
            QApplicationPrivate::hidden_focus_widget = nullptr;

        // hw: The test on getOpaqueRegion() needs to be more intelligent
        // currently it doesn't work if the widget is hidden (the region will
        // be clipped). The real check should be testing the cached region
        // (and dirty flag) directly.
        if (!q->isWindow() && q->parentWidget()) // && !d->getOpaqueRegion().isEmpty())
            q->parentWidget()->d_func()->setDirtyOpaqueRegion();

        if (!q->testAttribute(Qt::WA_WState_Hidden)) {
            q->setAttribute(Qt::WA_WState_Hidden);
            hide_helper();
        }

        // invalidate layout similar to updateGeometry()
        if (!q->isWindow() && q->parentWidget()) {
            if (q->parentWidget()->d_func()->layout)
                q->parentWidget()->d_func()->layout->invalidate();
            else if (q->parentWidget()->isVisible())
                QCoreApplication::postEvent(q->parentWidget(), new QEvent(QEvent::LayoutRequest));
        }

        QEvent hideToParentEvent(QEvent::HideToParent);
        QCoreApplication::sendEvent(q, &hideToParentEvent);
    }
}